

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O0

void * __thiscall mjs::gc_heap_ptr_untyped::get(gc_heap_ptr_untyped *this)

{
  gc_heap *this_00;
  slot *psVar1;
  gc_heap_ptr_untyped *this_local;
  
  if (this->heap_ != (gc_heap *)0x0) {
    this_00 = heap(this);
    psVar1 = gc_heap::get_at(this_00,this->pos_);
    return psVar1;
  }
  __assert_fail("heap_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1a2,"void *mjs::gc_heap_ptr_untyped::get() const");
}

Assistant:

void* get() const {
        assert(heap_);
        return heap().get_at(pos_);
    }